

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_matrix *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type *psVar3;
  _Rb_tree_header *p_Var4;
  size_type sVar5;
  size_type sVar6;
  undefined1 auVar7 [8];
  undefined8 uVar8;
  bool bVar9;
  undefined1 uVar10;
  int iVar11;
  uint32_t uVar12;
  ostream *poVar13;
  undefined8 *puVar14;
  const_iterator cVar15;
  long *plVar16;
  long *plVar17;
  mapped_type *pmVar18;
  undefined1 *__dest;
  _Base_ptr p_Var19;
  Property *args;
  long lVar20;
  size_type __n;
  char *__n_00;
  fmt fVar21;
  string *__v;
  double *pdVar22;
  matrix4d *pmVar23;
  _Base_ptr p_Var24;
  size_t i;
  ulong uVar25;
  long lVar26;
  byte bVar27;
  string attr_type_name;
  ParseResult ret_1;
  optional<tinyusdz::value::matrix4d> pv;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e_1;
  stringstream ss;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *target;
  undefined1 local_760 [8];
  char *local_758;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_750;
  Property *local_738;
  UsdPrimvarReader_matrix *local_730;
  AttrMetas *local_728;
  string local_720;
  optional<tinyusdz::Interpolation> local_700;
  undefined8 local_6f8;
  AttrMetas *local_6f0;
  Property *local_6e8;
  string *local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  string local_6b8;
  undefined1 local_698 [16];
  undefined1 local_688 [128];
  undefined1 local_608 [8];
  undefined1 local_600 [128];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_580;
  undefined1 local_550 [8];
  undefined1 local_548 [128];
  undefined1 local_4c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c0;
  undefined1 auStack_4b8 [16];
  undefined8 uStack_4a8;
  _Alloc_hider local_4a0;
  size_type local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_490;
  storage_union sStack_480;
  vtable_type *local_470;
  undefined8 uStack_468;
  pointer local_460;
  pointer pSStack_458;
  pointer local_450;
  undefined2 local_448;
  undefined1 local_440 [16];
  undefined1 uStack_430;
  undefined7 uStack_42f;
  bool bStack_428;
  undefined8 local_350;
  undefined8 local_348;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_340;
  undefined1 local_338 [32];
  long local_318 [5];
  string local_2f0 [16];
  long local_2e0 [2];
  string local_2d0;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined1 local_290 [40];
  storage_union sStack_268;
  vtable_type *local_258;
  _Base_ptr p_Stack_250;
  pointer local_248;
  pointer pSStack_240;
  pointer local_238;
  pointer pSStack_230;
  undefined1 local_228;
  pointer local_220;
  pointer pPStack_218;
  optional<tinyusdz::Interpolation> local_210;
  optional<unsigned_int> oStack_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  undefined1 local_1f0 [48];
  undefined1 local_1c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined8 uStack_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  undefined1 auStack_170 [32];
  optional<tinyusdz::Path::PathType> local_150;
  storage_t<tinyusdz::Token> sStack_148;
  optional<tinyusdz::Token> local_128;
  undefined1 local_100 [24];
  undefined4 local_e8 [8];
  undefined1 local_c8 [40];
  undefined1 local_a0 [16];
  storage_t<double> asStack_90 [2];
  undefined1 local_80 [40];
  undefined1 auStack_58 [40];
  
  bVar27 = 0;
  local_580._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_580._M_impl.super__Rb_tree_header._M_header;
  local_580._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_580._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_580._M_impl.super__Rb_tree_header._M_node_count = 0;
  target = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)err;
  local_6e0 = warn;
  local_580._M_impl.super__Rb_tree_header._M_header._M_right =
       local_580._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0._0_8_ = &local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_580,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &local_2a0) {
    operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
  }
  p_Var19 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_338._8_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  bVar9 = true;
  if (p_Var19 != (_Base_ptr)local_338._8_8_) {
    local_728 = &(preader->fallback)._metas;
    local_338._0_8_ = &(preader->fallback)._paths;
    local_348 = &(preader->fallback)._attrib;
    local_6e8 = (Property *)&preader->varname;
    local_6f0 = &(preader->result)._metas;
    local_350 = &(preader->result)._actual_type_name;
    local_340 = &(preader->super_ShaderNode).super_UsdShadePrim.props;
    local_730 = preader;
    do {
      local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6d8,*(long *)(p_Var19 + 1),
                 (long)&(p_Var19[1]._M_parent)->_M_color + *(long *)(p_Var19 + 1));
      local_738 = (Property *)(p_Var19 + 2);
      local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"inputs:fallback","");
      sVar6 = local_6d8._M_string_length;
      sVar5 = local_720._M_string_length;
      local_758 = local_750._M_local_buf + 8;
      local_750._M_allocated_capacity = 0;
      local_750._M_local_buf[8] = '\0';
      __n = local_6d8._M_string_length;
      if (local_720._M_string_length < local_6d8._M_string_length) {
        __n = local_720._M_string_length;
      }
      if (__n == 0) {
        if (local_6d8._M_string_length == local_720._M_string_length) goto LAB_0024dd1c;
LAB_0024e06b:
        local_760._0_4_ = 1;
      }
      else {
        iVar11 = bcmp(local_6d8._M_dataplus._M_p,local_720._M_dataplus._M_p,__n);
        if ((sVar6 != sVar5) || (iVar11 != 0)) goto LAB_0024e06b;
LAB_0024dd1c:
        if (((ulong)p_Var19[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_760._0_4_ = 7;
          local_698._0_8_ = &DAT_0000003e;
          local_4c8 = (undefined1  [8])auStack_4b8;
          local_4c8 = (undefined1  [8])
                      ::std::__cxx11::string::_M_create((ulong *)local_4c8,(ulong)local_698);
          auStack_4b8._0_8_ = local_698._0_8_;
          builtin_strncpy((char *)local_4c8,
                          "Property `{}` must be Attribute, but declared as Relationship.",0x3e);
          local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_698._0_8_;
          *(char *)((long)local_4c8 + local_698._0_8_) = '\0';
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_4c8,&local_720,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_698._0_8_);
          ::std::__cxx11::string::operator=((string *)&local_758,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
          }
          if (local_4c8 != (undefined1  [8])auStack_4b8) {
            operator_delete((void *)local_4c8,(ulong)(auStack_4b8._0_8_ + 1));
          }
        }
        if (p_Var19[6]._M_left != p_Var19[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_338._0_8_,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var19[6]._M_parent);
          local_760 = (undefined1  [8])((ulong)local_760 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_(&local_6b8,&local_738->_attrib);
        local_2b0._0_8_ = &local_2a0;
        local_2a0._M_allocated_capacity = 0x643478697274616d;
        local_2b0._8_8_ = 8;
        local_2a0._M_local_buf[8] = '\0';
        if (local_6b8._M_string_length == 8) {
          if (*(long *)local_6b8._M_dataplus._M_p != 0x643478697274616d) {
            auStack_4b8._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0x643478697274616d;
            local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
            auStack_4b8._8_8_ = auStack_4b8._8_8_ & 0xffffffffffffff00;
            local_4c8 = (undefined1  [8])auStack_4b8;
            if (*(long *)local_6b8._M_dataplus._M_p != 0x643478697274616d) goto LAB_0024deea;
          }
          iVar11 = *(int *)((long)&p_Var19[0x17]._M_parent + 4);
          if (iVar11 == 1) {
            if (p_Var19[5]._M_left == p_Var19[5]._M_parent) {
              if (p_Var19[4]._M_right == (_Base_ptr)0x0) {
                bVar9 = false;
              }
              else {
                iVar11 = (**(code **)p_Var19[4]._M_right)();
                bVar9 = iVar11 == 4;
              }
              uVar10 = (undefined1)p_Var19[5]._M_color;
              if ((bVar9) || ((uVar10 & _S_black) != _S_red)) {
                (local_730->fallback)._blocked = true;
              }
            }
            else {
              uVar10 = (undefined1)p_Var19[5]._M_color;
            }
            if (((((uVar10 & _S_black) == _S_red) && (p_Var19[4]._M_right != (_Base_ptr)0x0)) &&
                ((iVar11 = (**(code **)p_Var19[4]._M_right)(), iVar11 == 0 ||
                 ((p_Var19[4]._M_right != (_Base_ptr)0x0 &&
                  (iVar11 = (**(code **)p_Var19[4]._M_right)(), iVar11 == 1)))))) &&
               (p_Var19[5]._M_left == p_Var19[5]._M_parent)) {
              if (p_Var19[6]._M_left != p_Var19[6]._M_parent) {
                AttrMetas::operator=(local_728,(AttrMetas *)(p_Var19 + 7));
                __v = (string *)&local_6d8;
                goto LAB_0024e2b5;
              }
            }
            else {
              local_4c8 = (undefined1  [8])0x3ff0000000000000;
              auStack_4b8._8_8_ = 0;
              uStack_4a8._0_4_ = Varying;
              uStack_4a8._4_1_ = false;
              uStack_4a8._5_3_ = 0;
              local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              auStack_4b8._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_4a0._M_p = (pointer)0x3ff0000000000000;
              aStack_490._8_8_ = 0;
              sStack_480.dynamic = (void *)0x0;
              local_498 = 0;
              aStack_490._M_allocated_capacity = 0;
              sStack_480._8_8_ = 0x3ff0000000000000;
              local_460 = (pointer)0x0;
              pSStack_458 = (pointer)0x0;
              local_470 = (vtable_type *)0x0;
              uStack_468._0_1_ = false;
              uStack_468._1_7_ = 0;
              local_450 = (pointer)0x3ff0000000000000;
              local_448._0_1_ = false;
              local_448._1_1_ = 0;
              uStack_430 = 0;
              uStack_42f = 0;
              bStack_428 = false;
              local_440._0_8_ = (pointer)0x0;
              local_440[8] = 0;
              local_440._9_7_ = 0;
              bVar9 = primvar::PrimVar::is_valid((PrimVar *)&p_Var19[4]._M_parent);
              if (bVar9) {
                if ((((char)p_Var19[5]._M_color == _S_red) &&
                    (p_Var19[4]._M_right != (_Base_ptr)0x0)) &&
                   ((iVar11 = (**(code **)p_Var19[4]._M_right)(), iVar11 == 0 ||
                    ((p_Var19[4]._M_right != (_Base_ptr)0x0 &&
                     (iVar11 = (**(code **)p_Var19[4]._M_right)(), iVar11 == 1)))))) {
                  fVar21 = (fmt)0x0;
                }
                else {
                  primvar::PrimVar::get_value<tinyusdz::value::matrix4d>
                            ((optional<tinyusdz::value::matrix4d> *)local_608,
                             (PrimVar *)&p_Var19[4]._M_parent);
                  fVar21 = local_608[0];
                  if (local_608[0] != (fmt)0x0) {
                    memcpy(local_550 + 7,local_600,0x80);
                    memcpy(local_4c8,local_550 + 7,0x80);
                    local_448._0_1_ = true;
                    local_448._1_1_ = 0;
                  }
                }
                p_Var24 = p_Var19[5]._M_parent;
                if (p_Var19[5]._M_left == p_Var24) {
                  if (fVar21 == (fmt)0x0) goto LAB_0024f685;
                  local_318[2] = 0;
                  local_318[3] = 0;
                  local_6f8 = 0;
                  local_700.has_value_ = false;
                  local_700._1_3_ = 0;
                  local_700.contained = (storage_t<tinyusdz::Interpolation>)0x0;
                }
                else {
                  lVar26 = 0;
                  uVar25 = 0;
                  do {
                    if ((char)p_Var19[6]._M_color == _S_black) {
                      tinyusdz::value::TimeSamples::update((TimeSamples *)&p_Var19[5]._M_parent);
                      p_Var24 = p_Var19[5]._M_parent;
                    }
                    if (*(char *)((long)&p_Var24[1]._M_color + lVar26) == '\x01') {
                      TypedTimeSamples<tinyusdz::value::matrix4d>::add_blocked_sample
                                ((TypedTimeSamples<tinyusdz::value::matrix4d> *)local_440,
                                 *(double *)((long)&p_Var24->_M_color + lVar26));
                    }
                    else {
                      tinyusdz::value::Value::get_value<tinyusdz::value::matrix4d>
                                ((optional<tinyusdz::value::matrix4d> *)local_550,
                                 (Value *)((long)&p_Var24->_M_parent + lVar26),false);
                      local_608[0] = (fmt)local_550[0];
                      if (local_550[0] != (string)0x1) {
                        if ((pointer)local_440._0_8_ != (pointer)0x0) {
                          operator_delete((void *)local_440._0_8_,
                                          CONCAT71(uStack_42f,uStack_430) - local_440._0_8_);
                        }
                        goto LAB_0024f685;
                      }
                      pdVar22 = (double *)(local_550 + 8);
                      pmVar23 = (matrix4d *)local_600;
                      for (lVar20 = 0x10; lVar20 != 0; lVar20 = lVar20 + -1) {
                        pmVar23->m[0][0] = *pdVar22;
                        pdVar22 = pdVar22 + (ulong)bVar27 * -2 + 1;
                        pmVar23 = (matrix4d *)((long)pmVar23 + ((ulong)bVar27 * -2 + 1) * 8);
                      }
                      TypedTimeSamples<tinyusdz::value::matrix4d>::add_sample
                                ((TypedTimeSamples<tinyusdz::value::matrix4d> *)local_440,
                                 *(double *)((long)&p_Var24->_M_color + lVar26),
                                 (matrix4d *)local_600);
                    }
                    uVar25 = uVar25 + 1;
                    p_Var24 = p_Var19[5]._M_parent;
                    lVar26 = lVar26 + 0x28;
                  } while (uVar25 < (ulong)(((long)p_Var19[5]._M_left - (long)p_Var24 >> 3) *
                                           -0x3333333333333333));
                  local_318[3] = CONCAT71(local_440._9_7_,local_440[8]);
                  local_318[2] = local_440._0_8_;
                  local_700._1_7_ = uStack_42f;
                  local_700.has_value_ = (bool)uStack_430;
                  local_6f8 = CONCAT71(uStack_42f,bStack_428);
                }
                memcpy(local_698 + 7,local_4c8,0x82);
                local_2b0[0] = 1;
                memcpy((Animatable<tinyusdz::value::matrix4d> *)(local_2b0 + 8),local_698 + 7,0x82);
                local_220 = (pointer)local_318[2];
                pPStack_218 = (pointer)local_318[3];
                local_210 = local_700;
                oStack_208.has_value_ = SUB81(local_6f8,0);
                nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>>::
                operator=((optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>> *)local_348,
                          (Animatable<tinyusdz::value::matrix4d> *)(local_2b0 + 8));
                if (((local_2b0._0_8_ & 1) != 0) && (local_220 != (pointer)0x0)) {
                  operator_delete(local_220,(long)local_210 - (long)local_220);
                }
                AttrMetas::operator=(local_728,(AttrMetas *)(p_Var19 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_580,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_720);
                local_760 = (undefined1  [8])((ulong)local_760 & 0xffffffff00000000);
              }
              else {
LAB_0024f685:
                local_760._0_4_ = 8;
                warn = (string *)0x55;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_758,0,(char *)local_750._M_allocated_capacity,0x3dcb88);
              }
            }
          }
          else if (iVar11 == 0) {
            (local_730->fallback)._value_empty = true;
            AttrMetas::operator=(local_728,(AttrMetas *)(p_Var19 + 7));
            __v = &local_720;
LAB_0024e2b5:
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_580,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
            local_760 = (undefined1  [8])((ulong)local_760 & 0xffffffff00000000);
          }
          else {
            warn = (string *)0x25;
            ::std::__cxx11::string::_M_replace
                      ((ulong)&local_758,0,(char *)local_750._M_allocated_capacity,0x3dc8ba);
            local_760._0_4_ = 8;
          }
        }
        else {
LAB_0024deea:
          local_760._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0._M_local_buf,"Property type mismatch. ",0x18);
          poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0._M_local_buf,local_720._M_dataplus._M_p,
                               local_720._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," expects type `",0xf);
          auStack_4b8._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x643478697274616d;
          local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
          auStack_4b8._8_8_ = auStack_4b8._8_8_ & 0xffffffffffffff00;
          local_4c8 = (undefined1  [8])auStack_4b8;
          poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,auStack_4b8,8);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,"` but defined as type `",0x17);
          poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,local_6b8._M_dataplus._M_p,local_6b8._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"`",1);
          if (local_4c8 != (undefined1  [8])auStack_4b8) {
            operator_delete((void *)local_4c8,(ulong)(auStack_4b8._0_8_ + 1));
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&local_758,(string *)local_4c8);
          if (local_4c8 != (undefined1  [8])auStack_4b8) {
            operator_delete((void *)local_4c8,(ulong)(auStack_4b8._0_8_ + 1));
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&pSStack_230);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
          operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._M_dataplus._M_p != &local_720.field_2) {
        operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
      }
      iVar11 = 0;
      if (((ulong)local_760 & 0xfffffffd) == 0) {
        iVar11 = 3;
LAB_0024e356:
        bVar9 = false;
      }
      else {
        bVar9 = true;
        if (local_760._0_4_ != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar13 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x120a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          local_698._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_698,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_4c8,(fmt *)local_698,(string *)"inputs:fallback",
                     (char (*) [16])&local_758,warn);
          poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_4c8,(long)local_4c0);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
          if (local_4c8 != (undefined1  [8])auStack_4b8) {
            operator_delete((void *)local_4c8,(ulong)(auStack_4b8._0_8_ + 1));
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_698._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688) {
            operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
          }
          if (target != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar14 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                (local_698,(ulong)(target->_metas).interpolation);
            pcVar1 = (char *)(puVar14 + 2);
            if ((char *)*puVar14 == pcVar1) {
              auStack_4b8._0_8_ = *(undefined8 *)pcVar1;
              auStack_4b8._8_8_ = puVar14[3];
              local_4c8 = (undefined1  [8])auStack_4b8;
            }
            else {
              auStack_4b8._0_8_ = *(undefined8 *)pcVar1;
              local_4c8 = (undefined1  [8])*puVar14;
            }
            local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        puVar14[1];
            *puVar14 = pcVar1;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)target,(string *)local_4c8);
            if (local_4c8 != (undefined1  [8])auStack_4b8) {
              operator_delete((void *)local_4c8,(ulong)(auStack_4b8._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_698._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688) {
              operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
          iVar11 = 1;
          goto LAB_0024e356;
        }
      }
      if (local_758 != local_750._M_local_buf + 8) {
        operator_delete(local_758,CONCAT71(local_750._9_7_,local_750._M_local_buf[8]) + 1);
      }
      if (bVar9) {
        p_Var24 = p_Var19 + 1;
        iVar11 = ::std::__cxx11::string::compare((char *)p_Var24);
        if (iVar11 == 0) {
          local_2b0._0_8_ = &local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"inputs:varname","")
          ;
          cVar15 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_580,(key_type *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
          }
          if ((_Rb_tree_header *)cVar15._M_node == &local_580._M_impl.super__Rb_tree_header) {
            local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
            local_2b0._8_8_ = ((ulong)local_2b0._8_8_ >> 8 & 0xffffff) << 8;
            local_2a0._M_allocated_capacity = local_2a0._M_allocated_capacity & 0xffffffffffff0000;
            local_2a0._M_local_buf[8] = '\0';
            local_220 = (pointer)0x0;
            pPStack_218 = (pointer)((ulong)pPStack_218 & 0xffffffffffffff00);
            local_100._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_100._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_128.contained._16_8_ = 0;
            local_128.contained._24_8_ = 0;
            local_e8[0] = 0;
            local_e8[2] = 0;
            local_e8[3] = 0;
            sStack_268._8_1_ = 0;
            local_290._32_8_ = 0;
            sStack_268.dynamic = (void *)0x0;
            local_290._16_8_ = 0;
            local_290._24_8_ = 0;
            local_290._0_8_ = 0;
            local_290._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_228 = 0;
            local_238 = (pointer)0x0;
            pSStack_230 = (pointer)0x0;
            local_248 = (pointer)0x0;
            pSStack_240 = (pointer)0x0;
            local_258 = (vtable_type *)0x0;
            p_Stack_250 = (_Base_ptr)0x0;
            local_1f0[0] = 0;
            local_200._M_allocated_capacity = 0;
            local_200._8_8_ = 0;
            local_210.has_value_ = false;
            local_210._1_3_ = 0;
            local_210.contained = (storage_t<tinyusdz::Interpolation>)0x0;
            oStack_208.has_value_ = false;
            oStack_208._1_3_ = 0;
            oStack_208.contained = (storage_t<unsigned_int>)0x0;
            local_1f0[0x28] = 0;
            local_1f0._24_8_ = 0;
            local_1f0._32_8_ = 0;
            local_1f0._8_8_ = 0;
            local_1f0._16_8_ = 0;
            local_1a0._M_local_buf[0] = '\0';
            local_1c0._16_8_ = 0;
            local_1c0._24_8_ = 0;
            local_1c0._0_8_ = 0;
            local_1c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_170[8] = 0;
            aStack_180._8_8_ = 0;
            auStack_170._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_188 = 0;
            aStack_180._M_allocated_capacity = 0;
            local_1a0._8_8_ = 0;
            uStack_190 = 0;
            sStack_148._8_1_ = 0;
            local_150.has_value_ = false;
            local_150._1_3_ = 0;
            local_150.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
            sStack_148.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_170._16_8_ = 0;
            auStack_170._24_8_ = 0;
            local_128.contained._8_1_ = 0;
            local_128.has_value_ = false;
            local_128._1_7_ = 0;
            local_128.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            sStack_148._16_8_ = 0;
            sStack_148._24_8_ = 0;
            local_e8._16_8_ = local_e8;
            local_c8[0x20] = 0;
            local_c8._16_8_ = 0;
            local_c8._24_8_ = 0;
            local_c8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_c8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            asStack_90[0]._0_1_ = 0;
            asStack_90._1_8_ = 0;
            local_a0._0_8_ = 0;
            local_a0[8] = 0;
            local_a0._9_7_ = 0;
            auStack_58[0x18] = 0;
            auStack_58._25_8_ = 0;
            auStack_58._8_8_ = 0;
            auStack_58[0x10] = _S_red;
            auStack_58._17_7_ = 0;
            local_80._32_8_ = 0;
            auStack_58._0_8_ = 0;
            local_80._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_80._24_8_ = 0;
            local_80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_80._8_8_ = 0;
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            local_e8._24_8_ = local_e8._16_8_;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d0,*(long *)(p_Var19 + 1),
                       (long)&(p_Var19[1]._M_parent)->_M_color + *(long *)(p_Var19 + 1));
            warn = (string *)local_4c8;
            local_4c8 = (undefined1  [8])auStack_4b8;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
            err = (string *)local_2b0;
            anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                      ((ParseResult *)local_698,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_580,&local_2d0,local_738,warn,
                       (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
            if (local_4c8 != (undefined1  [8])auStack_4b8) {
              operator_delete((void *)local_4c8,(ulong)(auStack_4b8._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_698._0_4_ == TypeMismatch) {
              local_2f0._0_8_ = local_2e0;
              ::std::__cxx11::string::_M_construct<char*>
                        (local_2f0,*(long *)(p_Var19 + 1),
                         (long)&(p_Var19[1]._M_parent)->_M_color + *(long *)(p_Var19 + 1));
              warn = (string *)local_4c8;
              local_4c8 = (undefined1  [8])auStack_4b8;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
              args = local_738;
              err = (string *)local_6e8;
              (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                        ((ParseResult *)local_608,(_anonymous_namespace_ *)&local_580,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f0,(string *)local_738,(Property *)warn,(string *)local_6e8,
                         target);
              if (local_4c8 != (undefined1  [8])auStack_4b8) {
                operator_delete((void *)local_4c8,(ulong)(auStack_4b8._0_8_ + 1));
              }
              if ((long *)local_2f0._0_8_ != local_2e0) {
                operator_delete((void *)local_2f0._0_8_,local_2e0[0] + 1);
              }
              if (local_608._0_4_ == Success) {
                iVar11 = 3;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
                poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x1223);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                local_760 = (undefined1  [8])&local_750;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_760,"Faied to parse inputs:varname: {}","");
                fmt::format<std::__cxx11::string>
                          ((string *)local_550,(fmt *)local_760,(string *)local_600,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4c8,(char *)local_550,local_548._0_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                if (local_550 != (undefined1  [8])(local_550 + 0x10)) {
                  operator_delete((void *)local_550,local_548._8_8_ + 1);
                }
                if (local_760 != (undefined1  [8])&local_750) {
                  operator_delete((void *)local_760,(ulong)(local_750._M_allocated_capacity + 1));
                }
                if (target != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar16 = (long *)::std::__cxx11::string::_M_append
                                              (local_760,(ulong)(target->_metas).interpolation);
                  psVar3 = (size_type *)(plVar16 + 2);
                  if ((size_type *)*plVar16 == psVar3) {
                    local_548._8_8_ = *psVar3;
                    local_548._16_8_ = plVar16[3];
                    local_550 = (undefined1  [8])(local_550 + 0x10);
                  }
                  else {
                    local_548._8_8_ = *psVar3;
                    local_550 = (undefined1  [8])*plVar16;
                  }
                  local_548._0_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar16 + 1);
                  *plVar16 = (long)psVar3;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)target,(string *)local_550);
                  if (local_550 != (undefined1  [8])(local_550 + 0x10)) {
                    operator_delete((void *)local_550,local_548._8_8_ + 1);
                  }
                  if (local_760 != (undefined1  [8])&local_750) {
                    operator_delete((void *)local_760,(ulong)(local_750._M_allocated_capacity + 1));
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                ::std::ios_base::~ios_base((ios_base *)&pSStack_458);
                iVar11 = 1;
              }
              if (local_600._0_8_ != (long)local_600 + 0x10) {
                operator_delete((void *)local_600._0_8_,local_600._16_8_ + 1);
              }
            }
            else {
              iVar11 = 0;
              if (local_698._0_4_ == Success) {
                bVar9 = ConvertTokenAttributeToStringAttribute
                                  ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                   local_2b0,
                                   (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_6e8);
                iVar11 = 3;
                if (!bVar9) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3)
                  ;
                  poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x1211)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,
                             "Failed to convert inputs:varname token type to string type.",0x3b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"\n",1);
                  if (target != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar17 = (long *)::std::__cxx11::string::_M_append
                                                (local_550,(ulong)(target->_metas).interpolation);
                    plVar16 = plVar17 + 2;
                    if ((long *)*plVar17 == plVar16) {
                      local_600._8_8_ = *plVar16;
                      local_600._16_8_ = plVar17[3];
                      local_608 = (undefined1  [8])(local_600 + 8);
                    }
                    else {
                      local_600._8_8_ = *plVar16;
                      local_608 = (undefined1  [8])*plVar17;
                    }
                    local_600._0_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar17 + 1);
                    *plVar17 = (long)plVar16;
                    plVar17[1] = 0;
                    *(undefined1 *)(plVar17 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)target,(string *)local_608);
                    if (local_608 != (undefined1  [8])(local_600 + 8)) {
                      operator_delete((void *)local_608,(ulong)(local_600._8_8_ + 1));
                    }
                    if (local_550 != (undefined1  [8])(local_550 + 0x10)) {
                      operator_delete((void *)local_550,local_548._8_8_ + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                  ::std::ios_base::~ios_base((ios_base *)&pSStack_458);
                  iVar11 = 1;
                }
              }
            }
            if ((undefined1 *)local_698._8_8_ != local_688 + 8) {
              operator_delete((void *)local_698._8_8_,local_688._8_8_ + 1);
            }
            if (asStack_90[1]._0_1_ == '\x01') {
              nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
              destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *)local_80);
            }
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_a0);
            AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
            if (iVar11 != 0) goto LAB_0024f9d7;
          }
        }
        local_338._16_8_ = local_318;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_338 + 0x10),*(long *)(p_Var19 + 1),
                   (long)&(p_Var19[1]._M_parent)->_M_color + *(long *)(p_Var19 + 1));
        local_760 = (undefined1  [8])&local_750;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_760,"outputs:result","");
        uVar8 = local_338._24_8_;
        pcVar1 = local_758;
        local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (auStack_4b8 + 8);
        auStack_4b8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
        ;
        auStack_4b8._8_8_ = auStack_4b8._8_8_ & 0xffffffffffffff00;
        __n_00 = (char *)local_338._24_8_;
        if (local_758 < (ulong)local_338._24_8_) {
          __n_00 = local_758;
        }
        if (__n_00 == (char *)0x0) {
          if ((char *)local_338._24_8_ == local_758) goto LAB_0024e49f;
LAB_0024e4d7:
          local_4c8._0_4_ = 1;
        }
        else {
          iVar11 = bcmp((void *)local_338._16_8_,(void *)local_760,(size_t)__n_00);
          if (((char *)uVar8 != pcVar1) || (iVar11 != 0)) goto LAB_0024e4d7;
LAB_0024e49f:
          cVar15 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_580,(key_type *)local_760);
          if ((_Rb_tree_header *)cVar15._M_node == &local_580._M_impl.super__Rb_tree_header) {
            if (*(uint *)((long)&p_Var19[0x17]._M_parent + 4) < 2) {
              bVar9 = Attribute::is_connection(&local_738->_attrib);
              if (bVar9) {
                local_4c8._0_4_ = 5;
                warn = (string *)0x38;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_4c0,0,(char *)auStack_4b8._0_8_,0x3deb51);
              }
              else {
                if (*(int *)((long)&p_Var19[0x17]._M_parent + 4) != 0) goto LAB_0024f148;
                Attribute::type_name_abi_cxx11_((string *)local_2b0,&local_738->_attrib);
                bVar9 = tinyusdz::value::IsRoleType((string *)local_2b0);
                local_698._0_8_ = local_688;
                local_688._0_8_ = (pointer)0x643478697274616d;
                local_698._8_8_ = (pointer)0x8;
                local_688._8_8_ = local_688._8_8_ & 0xffffffffffffff00;
                if ((local_2b0._8_8_ == 8) && (*(size_type *)local_2b0._0_8_ == 0x643478697274616d))
                {
                  (local_730->result)._authored = true;
LAB_0024f6ed:
                  AttrMetas::operator=(local_6f0,(AttrMetas *)(p_Var19 + 7));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_580,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_760);
                  local_4c8 = (undefined1  [8])((ulong)local_4c8 & 0xffffffff00000000);
                }
                else {
                  if (bVar9) {
                    uVar12 = tinyusdz::value::GetUnderlyingTypeId((string *)local_2b0);
                    if (uVar12 == 0x38) {
                      (local_730->result)._authored = true;
                      ::std::__cxx11::string::_M_assign((string *)local_350);
                      goto LAB_0024f6ed;
                    }
                    local_4c8._0_4_ = 3;
                    local_608 = (undefined1  [8])(local_600 + 8);
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_608,
                               "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                               ,"");
                  }
                  else {
                    local_4c8._0_4_ = 3;
                    local_550 = (undefined1  [8])0x46;
                    local_608 = (undefined1  [8])(local_600 + 8);
                    __dest = (undefined1 *)
                             ::std::__cxx11::string::_M_create((ulong *)local_608,(ulong)local_550);
                    auVar7 = local_550;
                    local_600._8_8_ = local_550;
                    local_608 = (undefined1  [8])__dest;
                    memcpy(__dest,
                           "Property type mismatch. {} expects type `{}` but defined as type `{}`.",
                           0x46);
                    local_600._0_8_ = auVar7;
                    __dest[(long)auVar7] = 0;
                  }
                  local_550 = (undefined1  [8])(local_550 + 0x10);
                  local_548._16_8_ = local_548._16_8_ & 0xffffffffffffff00;
                  local_548._8_8_ = 0x643478697274616d;
                  local_548._0_8_ = (anon_struct_8_0_00000001_for___align)0x8;
                  warn = (string *)local_2b0;
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            ((string *)local_698,(fmt *)local_608,(string *)local_760,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_550,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0,err);
                  ::std::__cxx11::string::operator=((string *)&local_4c0,(string *)local_698);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_698._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688
                     ) {
                    operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
                  }
                  if (local_550 != (undefined1  [8])(local_550 + 0x10)) {
                    operator_delete((void *)local_550,local_548._8_8_ + 1);
                  }
                  if (local_608 != (undefined1  [8])(local_600 + 8)) {
                    operator_delete((void *)local_608,(ulong)(local_600._8_8_ + 1));
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._0_8_ != &local_2a0) {
                  operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
                }
              }
            }
            else {
LAB_0024f148:
              warn = (string *)&DAT_00000041;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_4c0,0,(char *)auStack_4b8._0_8_,0x3deb8a);
              local_4c8._0_4_ = 6;
            }
          }
          else {
            local_4c8._0_4_ = 2;
          }
        }
        if (local_760 != (undefined1  [8])&local_750) {
          operator_delete((void *)local_760,(ulong)(local_750._M_allocated_capacity + 1));
        }
        if ((long *)local_338._16_8_ != local_318) {
          operator_delete((void *)local_338._16_8_,local_318[0] + 1);
        }
        iVar11 = 0;
        if (((ulong)local_4c8 & 0xfffffffd) == 0) {
          iVar11 = 3;
LAB_0024ebbe:
          bVar9 = false;
        }
        else {
          bVar9 = true;
          if (local_4c8._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x1229);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            local_608 = (undefined1  [8])(local_600 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_608,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_698,(fmt *)local_608,(string *)"outputs:result",
                       (char (*) [15])&local_4c0,warn);
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_698._0_8_,local_698._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_698._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688) {
              operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
            }
            if (local_608 != (undefined1  [8])(local_600 + 8)) {
              operator_delete((void *)local_608,(ulong)(local_600._8_8_ + 1));
            }
            if (target != (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar16 = (long *)::std::__cxx11::string::_M_append
                                          (local_608,(ulong)(target->_metas).interpolation);
              pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar16 + 2);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16 ==
                  pbVar2) {
                local_688._0_8_ = (pbVar2->_M_dataplus)._M_p;
                local_688._8_8_ = plVar16[3];
                local_698._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688;
              }
              else {
                local_688._0_8_ = (pbVar2->_M_dataplus)._M_p;
                local_698._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar16;
              }
              local_698._8_8_ = plVar16[1];
              *plVar16 = (long)pbVar2;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)target,(string *)local_698);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_698._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688) {
                operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
              }
              if (local_608 != (undefined1  [8])(local_600 + 8)) {
                operator_delete((void *)local_608,(ulong)(local_600._8_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
            iVar11 = 1;
            goto LAB_0024ebbe;
          }
        }
        if (local_4c0 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(auStack_4b8 + 8))
        {
          operator_delete(local_4c0,auStack_4b8._8_8_ + 1);
        }
        if (!bVar9) goto LAB_0024f9d7;
        cVar15 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_580,(key_type *)p_Var24);
        p_Var4 = &local_580._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)cVar15._M_node == p_Var4) {
          pmVar18 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[](local_340,(key_type *)p_Var24);
          ::std::__cxx11::string::_M_assign((string *)pmVar18);
          (pmVar18->_attrib)._varying_authored = (bool)p_Var19[3].field_0x4;
          (pmVar18->_attrib)._variability = p_Var19[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar18->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar18->_attrib)._var,(any *)&p_Var19[4]._M_parent);
          (pmVar18->_attrib)._var._blocked = SUB41(p_Var19[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar18->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var19[5]._M_parent);
          (pmVar18->_attrib)._var._ts._dirty = SUB41(p_Var19[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar18->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var19[6]._M_parent);
          AttrMetas::operator=(&(pmVar18->_attrib)._metas,(AttrMetas *)(p_Var19 + 7));
          *(_Base_ptr *)&pmVar18->_listOpQual = p_Var19[0x17]._M_parent;
          (pmVar18->_rel).type = *(Type *)&p_Var19[0x17]._M_left;
          Path::operator=(&(pmVar18->_rel).targetPath,(Path *)&p_Var19[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar18->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var19[0x1e]._M_parent);
          (pmVar18->_rel).listOpQual = p_Var19[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar18->_rel)._metas,(AttrMetas *)&p_Var19[0x1f]._M_parent);
          (pmVar18->_rel)._varying_authored = *(bool *)&p_Var19[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar18->_prop_value_type_name);
          pmVar18->_has_custom = *(bool *)&p_Var19[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_580,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var24);
        }
        cVar15 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_580,(key_type *)p_Var24);
        if ((_Rb_tree_header *)cVar15._M_node == p_Var4) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar13 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x122b);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c8,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var24);
          poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_4c8,(long)local_4c0);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
          if (local_4c8 != (undefined1  [8])auStack_4b8) {
            operator_delete((void *)local_4c8,(ulong)(auStack_4b8._0_8_ + 1));
          }
          if (local_6e0 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar14 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                (local_698,(ulong)(target->_metas).interpolation);
            pcVar1 = (char *)(puVar14 + 2);
            if ((char *)*puVar14 == pcVar1) {
              auStack_4b8._0_8_ = *(undefined8 *)pcVar1;
              auStack_4b8._8_8_ = puVar14[3];
              local_4c8 = (undefined1  [8])auStack_4b8;
            }
            else {
              auStack_4b8._0_8_ = *(undefined8 *)pcVar1;
              local_4c8 = (undefined1  [8])*puVar14;
            }
            local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        puVar14[1];
            *puVar14 = pcVar1;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_6e0,(string *)local_4c8);
            if (local_4c8 != (undefined1  [8])auStack_4b8) {
              operator_delete((void *)local_4c8,(ulong)(auStack_4b8._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_698._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688) {
              operator_delete((void *)local_698._0_8_,(ulong)(local_688._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
        }
      }
      else {
LAB_0024f9d7:
        if ((iVar11 != 3) && (iVar11 != 0)) {
          bVar9 = false;
          goto LAB_0024fb56;
        }
      }
      p_Var19 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var19);
    } while (p_Var19 != (_Base_ptr)local_338._8_8_);
    bVar9 = true;
  }
LAB_0024fb56:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_580,(_Link_type)local_580._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar9;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_matrix>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_matrix *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_matrix,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_matrix, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_matrix, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}